

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

int nifti_intent_code(char *name)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  __int32_t **pp_Var4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  
  iVar5 = -1;
  if ((name != (char *)0x0) && (*name != '\0')) {
    sVar3 = strlen(name);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,name);
    for (pcVar6 = __dest; cVar1 = *pcVar6, (long)cVar1 != 0; pcVar6 = pcVar6 + 1) {
      pp_Var4 = __ctype_toupper_loc();
      *pcVar6 = (char)(*pp_Var4)[cVar1];
    }
    iVar5 = -1;
    for (lVar7 = 2; lVar7 != 0x19; lVar7 = lVar7 + 1) {
      iVar2 = strcmp(inam[lVar7],__dest);
      if (iVar2 == 0) {
        iVar5 = (int)lVar7;
        break;
      }
    }
    free(__dest);
  }
  return iVar5;
}

Assistant:

int nifti_intent_code( char *name )
{
   char *unam , *upt ;
   int ii ;

   if( name == NULL || *name == '\0' ) return -1 ;

   unam = (char *)malloc(strlen(name)+1);
   strcpy(unam,name);
   for( upt=unam ; *upt != '\0' ; upt++ ) *upt = (char)toupper(*upt) ;

   for( ii=NIFTI_FIRST_STATCODE ; ii <= NIFTI_LAST_STATCODE ; ii++ )
     if( strcmp(inam[ii],unam) == 0 ) break ;

   free(unam) ;
   return (ii <= NIFTI_LAST_STATCODE) ? ii : -1 ;
}